

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonGeneration.hpp
# Opt level: O3

string * helics::generateJsonErrorResponse
                   (string *__return_storage_ptr__,JsonErrorCodes code,string *message)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar1;
  string_view fmt;
  format_args args;
  string_t local_58;
  data local_38;
  pointer local_28;
  size_type sStack_20;
  
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::
  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_38,message);
  aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)0x3;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(&local_58,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)&local_38,-1,' ',true,hex);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_38);
  local_28 = local_58._M_dataplus._M_p;
  sStack_20 = local_58._M_string_length;
  fmt.size_ = 0xd1;
  fmt.data_ = (char *)0x37;
  args.field_1.args_ = aVar1.args_;
  args.desc_ = (unsigned_long_long)&local_38;
  local_38._0_4_ = code;
  ::fmt::v11::vformat_abi_cxx11_
            (__return_storage_ptr__,
             (v11 *)"{{\n  \"error\":{{\n    \"code\":{},\n    \"message\":{}\n  }}\n}}",fmt,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateJsonErrorResponse(JsonErrorCodes code, const std::string& message)
{
    return fmt::format("{{\n  \"error\":{{\n    \"code\":{},\n    \"message\":{}\n  }}\n}}",
                       static_cast<std::int32_t>(code),
                       generateJsonQuotedString(message));
}